

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O3

bool __thiscall
duckdb_httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Socket *pSVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar8;
  Request req2;
  Request req_save;
  key_type local_590;
  Error *local_570;
  Response *local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_540 [648];
  Request local_2b8;
  
  if ((req->path)._M_string_length == 0) {
    *error = Connection;
    return false;
  }
  Request::Request(&local_2b8,req);
  iVar4 = (*this->_vptr_ClientImpl[6])(this);
  if ((((char)iVar4 == '\0') && ((this->proxy_host_)._M_string_length != 0)) &&
     (this->proxy_port_ != -1)) {
    Request::Request((Request *)local_540,req);
    std::operator+(&local_560,"http://",&this->host_and_port_);
    local_568 = res;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_560,(ulong)(req->path)._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_590.field_2._M_allocated_capacity = *psVar6;
      local_590.field_2._8_8_ = plVar5[3];
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    }
    else {
      local_590.field_2._M_allocated_capacity = *psVar6;
      local_590._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_590._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_570 = error;
    std::__cxx11::string::operator=((string *)(local_540 + 0x20),(string *)&local_590);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    res = local_568;
    error = local_570;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p);
    }
    bVar3 = process_request(this,strm,(Request *)local_540,res,close_connection,error);
    Request::operator=(req,(Request *)local_540);
    std::__cxx11::string::_M_assign((string *)&req->path);
    Request::~Request((Request *)local_540);
  }
  else {
    bVar3 = process_request(this,strm,req,res,close_connection,error);
  }
  if (!bVar3) {
    bVar3 = false;
    goto LAB_00494b3b;
  }
  paVar1 = &local_590.field_2;
  local_590._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"Connection","");
  pVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(res->headers)._M_t,&local_590);
  if (pVar8.first._M_node._M_node == pVar8.second._M_node._M_node) {
    pcVar7 = anon_var_dwarf_63f17de + 9;
  }
  else {
    pcVar7 = *(char **)(pVar8.first._M_node._M_node + 2);
  }
  std::__cxx11::string::string((string *)local_540,pcVar7,(allocator *)&local_560);
  iVar4 = std::__cxx11::string::compare(local_540);
  if (iVar4 == 0) {
    if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
      operator_delete((void *)local_540._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != paVar1) {
      operator_delete(local_590._M_dataplus._M_p);
    }
LAB_004949ec:
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->socket_mutex_);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    pSVar2 = &this->socket_;
    (*this->_vptr_ClientImpl[4])(this,pSVar2,1);
    if (pSVar2->sock != -1) {
      shutdown(pSVar2->sock,2);
      if (pSVar2->sock != -1) {
        close(pSVar2->sock);
        pSVar2->sock = -1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->socket_mutex_);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)res);
    if (iVar4 == 0) {
      iVar4 = std::__cxx11::string::compare((char *)&res->reason);
      if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
        operator_delete((void *)local_540._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar1) {
        operator_delete(local_590._M_dataplus._M_p);
      }
      if (iVar4 != 0) goto LAB_004949ec;
    }
    else {
      if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
        operator_delete((void *)local_540._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar1) {
        operator_delete(local_590._M_dataplus._M_p);
      }
    }
  }
  bVar3 = true;
  if ((res->status - 0x12dU < 99) && (this->follow_location_ == true)) {
    Request::operator=(req,&local_2b8);
    bVar3 = redirect(this,req,res,error);
  }
LAB_00494b3b:
  Request::~Request(&local_2b8);
  return bVar3;
}

Assistant:

inline bool ClientImpl::handle_request(Stream &strm, Request &req,
                                       Response &res, bool close_connection,
                                       Error &error) {
  if (req.path.empty()) {
    error = Error::Connection;
    return false;
  }

  auto req_save = req;

  bool ret;

  if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
    auto req2 = req;
    req2.path = "http://" + host_and_port_ + req.path;
    ret = process_request(strm, req2, res, close_connection, error);
    req = req2;
    req.path = req_save.path;
  } else {
    ret = process_request(strm, req, res, close_connection, error);
  }

  if (!ret) { return false; }

  if (res.get_header_value("Connection") == "close" ||
      (res.version == "HTTP/1.0" && res.reason != "Connection established")) {
    // TODO this requires a not-entirely-obvious chain of calls to be correct
    // for this to be safe.

    // This is safe to call because handle_request is only called by send_
    // which locks the request mutex during the process. It would be a bug
    // to call it from a different thread since it's a thread-safety issue
    // to do these things to the socket if another thread is using the socket.
    std::lock_guard<std::mutex> guard(socket_mutex_);
    shutdown_ssl(socket_, true);
    shutdown_socket(socket_);
    close_socket(socket_);
  }

  if (300 < res.status && res.status < 400 && follow_location_) {
    req = req_save;
    ret = redirect(req, res, error);
  }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  if ((res.status == StatusCode::Unauthorized_401 ||
       res.status == StatusCode::ProxyAuthenticationRequired_407) &&
      req.authorization_count_ < 5) {
    auto is_proxy = res.status == StatusCode::ProxyAuthenticationRequired_407;
    const auto &username =
        is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
    const auto &password =
        is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

    if (!username.empty() && !password.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res, auth, is_proxy)) {
        Request new_req = req;
        new_req.authorization_count_ += 1;
        new_req.headers.erase(is_proxy ? "Proxy-Authorization"
                                       : "Authorization");
        new_req.headers.insert(detail::make_digest_authentication_header(
            req, auth, new_req.authorization_count_, detail::random_string(10),
            username, password, is_proxy));

        Response new_res;

        ret = send(new_req, new_res, error);
        if (ret) { res = new_res; }
      }
    }
  }
#endif

  return ret;
}